

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFileLocation.cxx
# Opt level: O0

void __thiscall cmSourceFileLocation::UpdateExtension(cmSourceFileLocation *this,string *name)

{
  cmMakefile *this_00;
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  char *ext_00;
  string *psVar4;
  bool local_121;
  string local_100;
  undefined1 local_e0 [8];
  string tryPath;
  string local_a0;
  cmake *local_80;
  cmake *cm;
  cmMakefile *mf;
  cmGlobalGenerator *gg;
  string local_58 [32];
  undefined1 local_38 [8];
  string ext;
  string *name_local;
  cmSourceFileLocation *this_local;
  
  ext.field_2._8_8_ = name;
  if (this->Makefile == (cmMakefile *)0x0) {
    __assert_fail("this->Makefile",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmSourceFileLocation.cxx"
                  ,0x59,"void cmSourceFileLocation::UpdateExtension(const std::string &)");
  }
  cmsys::SystemTools::GetFilenameLastExtension((string *)local_38,name);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::substr((ulong)local_58,(ulong)local_38);
    std::__cxx11::string::operator=((string *)local_38,local_58);
    std::__cxx11::string::~string(local_58);
  }
  mf = (cmMakefile *)cmMakefile::GetGlobalGenerator(this->Makefile);
  cm = (cmake *)this->Makefile;
  local_80 = cmMakefile::GetCMakeInstance((cmMakefile *)cm);
  this_00 = mf;
  ext_00 = (char *)std::__cxx11::string::c_str();
  cmGlobalGenerator::GetLanguageFromExtension_abi_cxx11_
            (&local_a0,(cmGlobalGenerator *)this_00,ext_00);
  bVar1 = std::__cxx11::string::empty();
  local_121 = true;
  if ((bVar1 & 1) != 0) {
    bVar2 = cmake::IsSourceExtension(local_80,(string *)local_38);
    local_121 = true;
    if (!bVar2) {
      local_121 = cmake::IsHeaderExtension(local_80,(string *)local_38);
    }
  }
  std::__cxx11::string::~string((string *)&local_a0);
  if (local_121 == false) {
    std::__cxx11::string::string((string *)local_e0);
    if ((this->AmbiguousDirectory & 1U) != 0) {
      psVar4 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this->Makefile);
      std::__cxx11::string::operator=((string *)local_e0,(string *)psVar4);
      std::__cxx11::string::operator+=((string *)local_e0,"/");
    }
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)local_e0,(string *)&this->Directory);
      std::__cxx11::string::operator+=((string *)local_e0,"/");
    }
    std::__cxx11::string::operator+=((string *)local_e0,(string *)&this->Name);
    bVar2 = cmsys::SystemTools::FileExists((string *)local_e0,true);
    if (bVar2) {
      cmsys::SystemTools::GetFilenameName(&local_100,(string *)ext.field_2._8_8_);
      std::__cxx11::string::operator=((string *)&this->Name,(string *)&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      this->AmbiguousExtension = false;
      if ((this->AmbiguousDirectory & 1U) != 0) {
        DirectoryUseSource(this);
      }
    }
    std::__cxx11::string::~string((string *)local_e0);
  }
  else {
    cmsys::SystemTools::GetFilenameName
              ((string *)((long)&tryPath.field_2 + 8),(string *)ext.field_2._8_8_);
    std::__cxx11::string::operator=
              ((string *)&this->Name,(string *)(tryPath.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(tryPath.field_2._M_local_buf + 8));
    this->AmbiguousExtension = false;
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmSourceFileLocation::UpdateExtension(const std::string& name)
{
  assert(this->Makefile);
  // Check the extension.
  std::string ext = cmSystemTools::GetFilenameLastExtension(name);
  if (!ext.empty()) {
    ext = ext.substr(1);
  }

  // The global generator checks extensions of enabled languages.
  cmGlobalGenerator* gg = this->Makefile->GetGlobalGenerator();
  cmMakefile const* mf = this->Makefile;
  auto cm = mf->GetCMakeInstance();
  if (!gg->GetLanguageFromExtension(ext.c_str()).empty() ||
      cm->IsSourceExtension(ext) || cm->IsHeaderExtension(ext)) {
    // This is a known extension.  Use the given filename with extension.
    this->Name = cmSystemTools::GetFilenameName(name);
    this->AmbiguousExtension = false;
  } else {
    // This is not a known extension.  See if the file exists on disk as
    // named.
    std::string tryPath;
    if (this->AmbiguousDirectory) {
      // Check the source tree only because a file in the build tree should
      // be specified by full path at least once.  We do not want this
      // detection to depend on whether the project has already been built.
      tryPath = this->Makefile->GetCurrentSourceDirectory();
      tryPath += "/";
    }
    if (!this->Directory.empty()) {
      tryPath += this->Directory;
      tryPath += "/";
    }
    tryPath += this->Name;
    if (cmSystemTools::FileExists(tryPath, true)) {
      // We found a source file named by the user on disk.  Trust it's
      // extension.
      this->Name = cmSystemTools::GetFilenameName(name);
      this->AmbiguousExtension = false;

      // If the directory was ambiguous, it isn't anymore.
      if (this->AmbiguousDirectory) {
        this->DirectoryUseSource();
      }
    }
  }
}